

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void helper_msa_ld_h_mipsel(CPUMIPSState_conflict2 *env,uint32_t wd,target_ulong_conflict addr)

{
  tcg_target_ulong tVar1;
  TCGMemOpIdx oi;
  long lVar2;
  uintptr_t unaff_retaddr;
  
  lVar2 = (ulong)wd * 0x10;
  oi = 0x713;
  if ((env->hflags >> 0x1c & 1) == 0) {
    oi = env->hflags & 3 | 0x710;
  }
  tVar1 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr,oi,unaff_retaddr);
  *(short *)((env->active_fpu).fpr + wd) = (short)tVar1;
  tVar1 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 2,oi,unaff_retaddr);
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 2) = (short)tVar1;
  tVar1 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 4,oi,unaff_retaddr);
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 4) = (short)tVar1;
  tVar1 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 6,oi,unaff_retaddr);
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 6) = (short)tVar1;
  tVar1 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 8,oi,unaff_retaddr);
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 8) = (short)tVar1;
  tVar1 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 10,oi,unaff_retaddr);
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 10) = (short)tVar1;
  tVar1 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 0xc,oi,unaff_retaddr);
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = (short)tVar1;
  tVar1 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 0xe,oi,unaff_retaddr);
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xe) = (short)tVar1;
  return;
}

Assistant:

void helper_msa_ld_h(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    MEMOP_IDX(DF_HALF)
#if !defined(HOST_WORDS_BIGENDIAN)
    pwd->h[0] = helper_ret_lduw_mmu(env, addr + (0 << DF_HALF), oi, GETPC());
    pwd->h[1] = helper_ret_lduw_mmu(env, addr + (1 << DF_HALF), oi, GETPC());
    pwd->h[2] = helper_ret_lduw_mmu(env, addr + (2 << DF_HALF), oi, GETPC());
    pwd->h[3] = helper_ret_lduw_mmu(env, addr + (3 << DF_HALF), oi, GETPC());
    pwd->h[4] = helper_ret_lduw_mmu(env, addr + (4 << DF_HALF), oi, GETPC());
    pwd->h[5] = helper_ret_lduw_mmu(env, addr + (5 << DF_HALF), oi, GETPC());
    pwd->h[6] = helper_ret_lduw_mmu(env, addr + (6 << DF_HALF), oi, GETPC());
    pwd->h[7] = helper_ret_lduw_mmu(env, addr + (7 << DF_HALF), oi, GETPC());
#else
    pwd->h[0] = helper_ret_lduw_mmu(env, addr + (3 << DF_HALF), oi, GETPC());
    pwd->h[1] = helper_ret_lduw_mmu(env, addr + (2 << DF_HALF), oi, GETPC());
    pwd->h[2] = helper_ret_lduw_mmu(env, addr + (1 << DF_HALF), oi, GETPC());
    pwd->h[3] = helper_ret_lduw_mmu(env, addr + (0 << DF_HALF), oi, GETPC());
    pwd->h[4] = helper_ret_lduw_mmu(env, addr + (7 << DF_HALF), oi, GETPC());
    pwd->h[5] = helper_ret_lduw_mmu(env, addr + (6 << DF_HALF), oi, GETPC());
    pwd->h[6] = helper_ret_lduw_mmu(env, addr + (5 << DF_HALF), oi, GETPC());
    pwd->h[7] = helper_ret_lduw_mmu(env, addr + (4 << DF_HALF), oi, GETPC());
#endif
}